

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::TextureViewTestViewSampling::iterate(TextureViewTestViewSampling *this)

{
  TestContext **ppTVar1;
  ostringstream *this_00;
  ostringstream *this_01;
  GLenum texture_target;
  GLenum view_texture_target;
  ContextInfo *pCVar2;
  bool bVar3;
  bool bVar4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  NotSupportedError *this_02;
  char *description;
  qpTestResult testResult;
  GLenum *pGVar6;
  GLenum *pGVar7;
  GLenum *pGVar8;
  _compatible_texture_target_pairs texture_target_pairs;
  GLenum *local_1c8;
  GLenum *local_1c0;
  long local_1b8;
  undefined1 local_1b0 [16];
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  
  pCVar2 = ((this->super_TestCase).m_context)->m_contextInfo;
  _Var5 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[20]>>
                    ((pCVar2->m_extensions).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (pCVar2->m_extensions).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,"GL_ARB_texture_view");
  if (_Var5._M_current ==
      (pCVar2->m_extensions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_1b0._0_8_ = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"GL_ARB_texture_view is not supported","");
    tcu::NotSupportedError::NotSupportedError(this_02,(string *)local_1b0);
    __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  initTest(this);
  initPerSampleFillerProgramObject(this);
  TextureViewUtilities::getLegalTextureAndViewTargetCombinations();
  if (local_1c8 == local_1c0) {
LAB_00a33aa6:
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    ppTVar1 = &(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    this_00 = (ostringstream *)(local_1b0 + 8);
    bVar4 = false;
    pGVar7 = local_1c8;
    do {
      while( true ) {
        pGVar6 = pGVar7 + 2;
        texture_target = *pGVar7;
        view_texture_target = pGVar7[1];
        initTextureObject(this,false,texture_target,view_texture_target);
        initTextureObject(this,true,texture_target,view_texture_target);
        initParentTextureContents(this);
        initIterationSpecificProgramObject(this);
        bVar3 = executeTest(this);
        if (!bVar3) break;
        local_1b0._0_8_ = (*ppTVar1)->m_log;
        this_01 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_01);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_01,"Test case succeeded.",0x14);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_01);
        std::ios_base::~ios_base(local_138);
        pGVar8 = pGVar7 + 2;
        pGVar7 = pGVar6;
        if (pGVar8 == local_1c0) {
          testResult = QP_TEST_RESULT_FAIL;
          description = "Fail";
          if (bVar4) goto LAB_00a33ab6;
          goto LAB_00a33aa6;
        }
      }
      local_1b0._0_8_ = (*ppTVar1)->m_log;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Test case failed.",0x11);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_138);
      bVar4 = true;
      pGVar7 = pGVar6;
    } while (pGVar6 != local_1c0);
    testResult = QP_TEST_RESULT_FAIL;
    description = "Fail";
  }
LAB_00a33ab6:
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,description);
  if (local_1c8 != (GLenum *)0x0) {
    operator_delete(local_1c8,local_1b8 - (long)local_1c8);
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TextureViewTestViewSampling::iterate()
{
	bool has_failed = false;

	/* Make sure GL_ARB_texture_view is reported as supported before carrying on
	 * with actual execution */
	const std::vector<std::string>& extensions = m_context.getContextInfo().getExtensions();

	if (std::find(extensions.begin(), extensions.end(), "GL_ARB_texture_view") == extensions.end())
	{
		throw tcu::NotSupportedError("GL_ARB_texture_view is not supported");
	}

	/* Initialize all objects required to run the test */
	initTest();

	/* Initialize per-sample filler program */
	initPerSampleFillerProgramObject();

	/* Iterate through all texture/view texture target combinations */
	TextureViewUtilities::_compatible_texture_target_pairs_const_iterator texture_target_iterator;
	TextureViewUtilities::_compatible_texture_target_pairs				  texture_target_pairs =
		TextureViewUtilities::getLegalTextureAndViewTargetCombinations();

	for (texture_target_iterator = texture_target_pairs.begin(); texture_target_iterator != texture_target_pairs.end();
		 ++texture_target_iterator)
	{
		const glw::GLenum parent_texture_target = texture_target_iterator->first;
		const glw::GLenum view_texture_target   = texture_target_iterator->second;

		/* Initialize parent texture */
		initTextureObject(false /* is_view_texture */, parent_texture_target, view_texture_target);

		/* Initialize view */
		initTextureObject(true /* is_view_texture */, parent_texture_target, view_texture_target);

		/* Initialize contents of the parent texture */
		initParentTextureContents();

		/* Initialize iteration-specific test program object */
		initIterationSpecificProgramObject();

		/* Run the actual test */
		bool status = executeTest();

		if (!status)
		{
			has_failed = true;

			m_testCtx.getLog() << tcu::TestLog::Message << "Test case failed." << tcu::TestLog::EndMessage;
		}
		else
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Test case succeeded." << tcu::TestLog::EndMessage;
		}
	}

	if (!has_failed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}